

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask27_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x1b | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 5;
  *puVar1 = in[2] << 0x16 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] >> 10;
  *puVar1 = in[3] << 0x11 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[3] >> 0xf;
  *puVar1 = in[4] << 0xc | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[4] >> 0x14;
  *puVar1 = in[5] << 7 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[5] >> 0x19;
  *puVar1 = in[6] << 2 | *puVar1;
  *puVar1 = in[7] << 0x1d | *puVar1;
  out[6] = in[7] >> 3;
  return out + 7;
}

Assistant:

uint32_t *__fastpackwithoutmask27_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (27 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (27 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (27 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (27 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++out;
  *out = ((*in)) >> (27 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (27 - 24);
  ++in;

  return out + 1;
}